

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void anon_unknown.dwarf_153727::Stop(ParseContext *ctx,Lexeme *pos,char *msg,...)

{
  LexemeType LVar1;
  Lexeme *pos_00;
  char in_AL;
  int iVar2;
  undefined4 extraout_var;
  Lexeme *end;
  undefined8 in_RCX;
  char *pos_01;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  InplaceStr value;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &args[0].overflow_arg_area;
  local_d8.gp_offset = 0x18;
  local_d8.fp_offset = 0x30;
  if ((ctx->lastLexeme == pos) && (ctx->firstLexeme != pos)) {
    pos_01 = pos[-1].pos + pos[-1].length;
    pos = pos + -1;
  }
  else {
    pos_01 = pos->pos;
  }
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  StopAt(ctx,pos,pos,pos_01,msg,&local_d8);
  pos_00 = ctx->currentLexeme;
  LVar1 = pos_00->type;
  if (LVar1 == lex_at) {
    ctx->currentLexeme = pos_00 + 1;
    if (pos_00[1].type != lex_quotedstring) {
      ctx->currentLexeme = pos_00;
      return;
    }
  }
  else if (LVar1 != lex_quotedstring) {
    return;
  }
  value = ParseContext::Consume(ctx);
  iVar2 = (int)value.end - (int)value.begin;
  if ((iVar2 == 1) || (value.begin[iVar2 - 1] != '\"')) {
    Report(ctx,pos_00,"ERROR: unclosed string constant");
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  end = ParseContext::Previous(ctx);
  SynString::SynString((SynString *)CONCAT44(extraout_var,iVar2),pos_00,end,LVar1 == lex_at,value);
  return;
}

Assistant:

void Stop(ParseContext &ctx, Lexeme *pos, const char *msg, ...)
	{
		va_list args;
		va_start(args, msg);

		if(pos == ctx.Last() && pos != ctx.First())
			StopAt(ctx, pos - 1, pos - 1, (pos - 1)->pos + (pos - 1)->length, msg, args);
		else
			StopAt(ctx, pos, pos, pos->pos, msg, args);
	}